

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

DBErrors __thiscall wallet::CWallet::ReorderTransactions(CWallet *this)

{
  long lVar1;
  mutex_type *pmVar2;
  bool bVar3;
  reference ppVar4;
  int64_t *piVar5;
  reference plVar6;
  long *plVar7;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RDI;
  long in_FS_OFFSET;
  pair<unsigned_int,_wallet::CWalletTx_*> pVar8;
  int64_t *nOffsetStart;
  vector<long,_std::allocator<long>_> *__range3;
  int64_t nOrderPosOff;
  int64_t *nOrderPos;
  CWalletTx *pwtx;
  pair<const_uint256,_wallet::CWalletTx> *entry;
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  *__range1;
  iterator __end3;
  iterator __begin3;
  iterator it;
  vector<long,_std::allocator<long>_> nOrderPosOffsets;
  CWalletTx *wtx;
  iterator __end1;
  iterator __begin1;
  WalletBatch batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  TxItems txByTime;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  WalletDatabase *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined1 in_stack_fffffffffffffeab;
  int in_stack_fffffffffffffeac;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_int,_CWalletTx_*>_>::value,_iterator>
  in_stack_fffffffffffffeb0;
  CWalletTx *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  long local_118;
  DBErrors local_c4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_RDI,(AnnotatedMixin<std::recursive_mutex> *)
                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (char *)in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0._M_node,
             in_stack_fffffffffffffeac,(bool)in_stack_fffffffffffffeab);
  GetDatabase((CWallet *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  WalletBatch::WalletBatch
            ((WalletBatch *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             in_stack_fffffffffffffe90,(bool)in_stack_fffffffffffffe8f);
  std::
  multimap<long,_wallet::CWalletTx_*,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
  ::multimap((multimap<long,_wallet::CWalletTx_*,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
              *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  _GLOBAL__N_1::std::
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  ::begin((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
           *)in_stack_fffffffffffffe90);
  _GLOBAL__N_1::std::
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  ::end((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
         *)in_stack_fffffffffffffe90);
  while (bVar3 = _GLOBAL__N_1::std::__detail::operator==
                           ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                             *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                            (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                             *)in_stack_fffffffffffffe90), ((bVar3 ^ 0xffU) & 1) != 0) {
    _GLOBAL__N_1::std::__detail::
    _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::operator*
              ((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
               CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    pVar8 = std::make_pair<unsigned_int&,wallet::CWalletTx*&>
                      ((uint *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       (CWalletTx **)in_stack_fffffffffffffe90);
    in_stack_fffffffffffffeb8 = pVar8.second;
    in_stack_fffffffffffffeb0 =
         std::
         multimap<long,wallet::CWalletTx*,std::less<long>,std::allocator<std::pair<long_const,wallet::CWalletTx*>>>
         ::insert<std::pair<unsigned_int,wallet::CWalletTx*>>
                   ((multimap<long,_wallet::CWalletTx_*,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
                     *)in_stack_fffffffffffffe90,
                    (pair<unsigned_int,_wallet::CWalletTx_*> *)
                    CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    _GLOBAL__N_1::std::__detail::
    _Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::operator++
              ((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
               CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  }
  in_RDI[0x2c].super_unique_lock._M_device = (mutex_type *)0x0;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  std::
  multimap<long,_wallet::CWalletTx_*,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
  ::begin((multimap<long,_wallet::CWalletTx_*,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
           *)in_stack_fffffffffffffe90);
  do {
    std::
    multimap<long,_wallet::CWalletTx_*,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
    ::end((multimap<long,_wallet::CWalletTx_*,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
           *)in_stack_fffffffffffffe90);
    bVar3 = std::operator==((_Self *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                            (_Self *)in_stack_fffffffffffffe90);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      WalletBatch::WriteOrderPosNext
                ((WalletBatch *)in_stack_fffffffffffffe90,
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      local_c4 = LOAD_OK;
LAB_00ad8003:
      std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      std::
      multimap<long,_wallet::CWalletTx_*,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
      ::~multimap((multimap<long,_wallet::CWalletTx_*,_std::less<long>,_std::allocator<std::pair<const_long,_wallet::CWalletTx_*>_>_>
                   *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
      WalletBatch::~WalletBatch
                ((WalletBatch *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                 CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return local_c4;
    }
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_long,_wallet::CWalletTx_*>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_long,_wallet::CWalletTx_*>_> *)
                        CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
    piVar5 = &ppVar4->second->nOrderPos;
    if (*piVar5 == -1) {
      pmVar2 = in_RDI[0x2c].super_unique_lock._M_device;
      in_RDI[0x2c].super_unique_lock._M_device =
           (mutex_type *)((long)&(pmVar2->super___recursive_mutex_base)._M_mutex + 1);
      *piVar5 = (int64_t)pmVar2;
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)
                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 (value_type_conflict3 *)in_stack_fffffffffffffe90);
      bVar3 = WalletBatch::WriteTx
                        ((WalletBatch *)in_stack_fffffffffffffeb8,
                         (CWalletTx *)in_stack_fffffffffffffeb0._M_node);
      if (!bVar3) {
        local_c4 = LOAD_FAIL;
        goto LAB_00ad8003;
      }
    }
    else {
      local_118 = 0;
      std::vector<long,_std::allocator<long>_>::begin
                ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe90);
      std::vector<long,_std::allocator<long>_>::end
                ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffe90);
      while (bVar3 = __gnu_cxx::operator==<long_*,_std::vector<long,_std::allocator<long>_>_>
                               ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                 *)in_stack_fffffffffffffe90), ((bVar3 ^ 0xffU) & 1) != 0) {
        plVar6 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator*((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
        if (*plVar6 <= *piVar5) {
          local_118 = local_118 + 1;
        }
        __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                  ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                   CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
      }
      *piVar5 = *piVar5 + local_118;
      plVar7 = std::max<long>((long *)in_stack_fffffffffffffe90,
                              (long *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88))
      ;
      in_RDI[0x2c].super_unique_lock._M_device = (mutex_type *)*plVar7;
      if (local_118 != 0) {
        bVar3 = WalletBatch::WriteTx
                          ((WalletBatch *)in_stack_fffffffffffffeb8,
                           (CWalletTx *)in_stack_fffffffffffffeb0._M_node);
        in_stack_fffffffffffffe9c = CONCAT13(bVar3,(int3)in_stack_fffffffffffffe9c);
        if (!bVar3) {
          local_c4 = LOAD_FAIL;
          goto LAB_00ad8003;
        }
      }
    }
    std::_Rb_tree_iterator<std::pair<const_long,_wallet::CWalletTx_*>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_long,_wallet::CWalletTx_*>_> *)
               CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88));
  } while( true );
}

Assistant:

DBErrors CWallet::ReorderTransactions()
{
    LOCK(cs_wallet);
    WalletBatch batch(GetDatabase());

    // Old wallets didn't have any defined order for transactions
    // Probably a bad idea to change the output of this

    // First: get all CWalletTx into a sorted-by-time multimap.
    typedef std::multimap<int64_t, CWalletTx*> TxItems;
    TxItems txByTime;

    for (auto& entry : mapWallet)
    {
        CWalletTx* wtx = &entry.second;
        txByTime.insert(std::make_pair(wtx->nTimeReceived, wtx));
    }

    nOrderPosNext = 0;
    std::vector<int64_t> nOrderPosOffsets;
    for (TxItems::iterator it = txByTime.begin(); it != txByTime.end(); ++it)
    {
        CWalletTx *const pwtx = (*it).second;
        int64_t& nOrderPos = pwtx->nOrderPos;

        if (nOrderPos == -1)
        {
            nOrderPos = nOrderPosNext++;
            nOrderPosOffsets.push_back(nOrderPos);

            if (!batch.WriteTx(*pwtx))
                return DBErrors::LOAD_FAIL;
        }
        else
        {
            int64_t nOrderPosOff = 0;
            for (const int64_t& nOffsetStart : nOrderPosOffsets)
            {
                if (nOrderPos >= nOffsetStart)
                    ++nOrderPosOff;
            }
            nOrderPos += nOrderPosOff;
            nOrderPosNext = std::max(nOrderPosNext, nOrderPos + 1);

            if (!nOrderPosOff)
                continue;

            // Since we're changing the order, write it back
            if (!batch.WriteTx(*pwtx))
                return DBErrors::LOAD_FAIL;
        }
    }
    batch.WriteOrderPosNext(nOrderPosNext);

    return DBErrors::LOAD_OK;
}